

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

int send_telemetry_with_device_client
              (BACK_COMPAT_HANDLE handle,DEVICE_CREATION_TYPE create_type,
              MESSAGE_CREATION_MECHANISM msg_type,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool _Var1;
  IOTHUB_CLIENT_RESULT iothub_result;
  int iVar2;
  byte local_51;
  tickcounter_ms_t local_50;
  tickcounter_ms_t start_time;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client;
  BACK_COMPAT_MSG_CTX bc_msg_ctx;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER p_Stack_20;
  int result;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol_local;
  MESSAGE_CREATION_MECHANISM msg_type_local;
  DEVICE_CREATION_TYPE create_type_local;
  BACK_COMPAT_HANDLE handle_local;
  
  p_Stack_20 = protocol;
  memset((void *)((long)&device_client + 1),0,3);
  l = (LOGGER_LOG)create_device_client(handle,create_type,p_Stack_20);
  if ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l == (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
             ,"send_telemetry_with_device_client",0x268,1,"Failure creating davice client");
    }
  }
  else {
    iothub_result =
         IoTHubDeviceClient_LL_SetConnectionStatusCallback
                   ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l,connection_status_callback,
                    (void *)((long)&device_client + 1));
    _Var1 = check_iothub_result(iothub_result);
    if (_Var1) {
      iVar2 = send_telemetry_message
                        ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l,msg_type,
                         (void *)((long)&device_client + 1));
      if (iVar2 == 0) {
        tickcounter_get_current_ms(handle->tick_cntr_handle,&local_50);
        device_client._4_4_ = 0;
        do {
          IoTHubDeviceClient_LL_DoWork((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l);
          local_51 = 0;
          if ((device_client._1_1_ & 1) == 0) {
            _Var1 = is_operation_timed_out(handle->tick_cntr_handle,local_50,0x78);
            local_51 = _Var1 ^ 0xff;
          }
        } while ((local_51 & 1) != 0);
      }
      else {
        start_time = (tickcounter_ms_t)xlogging_get_log_function();
        if ((LOGGER_LOG)start_time != (LOGGER_LOG)0x0) {
          (*(code *)start_time)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                     ,"send_telemetry_with_device_client",0x274,1,
                     "Failure sending telemetry message");
        }
        device_client._4_4_ = 0x275;
      }
    }
    else {
      l_2 = xlogging_get_log_function();
      if (l_2 != (LOGGER_LOG)0x0) {
        (*l_2)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
               ,"send_telemetry_with_device_client",0x26f,1,
               "Failure setting connection status callback");
      }
      device_client._4_4_ = 0x270;
    }
    IoTHubDeviceClient_LL_Destroy((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l);
    if (handle->transport_handle != (TRANSPORT_HANDLE)0x0) {
      IoTHubTransport_Destroy(handle->transport_handle);
    }
  }
  return 0;
}

Assistant:

int send_telemetry_with_device_client(BACK_COMPAT_HANDLE handle, DEVICE_CREATION_TYPE create_type, MESSAGE_CREATION_MECHANISM msg_type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    int result;
    BACK_COMPAT_MSG_CTX bc_msg_ctx = { 0 };
    IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client = create_device_client(handle, create_type, protocol);
    if (device_client == NULL)
    {
        LogError("Failure creating davice client");
        result = __LINE__;
    }
    else
    {
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetConnectionStatusCallback(device_client, connection_status_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting connection status callback");
            result = __LINE__;
        }
        else if (send_telemetry_message(device_client, msg_type, &bc_msg_ctx) != 0)
        {
            LogError("Failure sending telemetry message");
            result = __LINE__;
        }
        else
        {
            tickcounter_ms_t start_time;
            (void)tickcounter_get_current_ms(handle->tick_cntr_handle, &start_time);
            result = 0;
            do
            {
                IoTHubDeviceClient_LL_DoWork(device_client);
            } while (!bc_msg_ctx.callback_recv && !is_operation_timed_out(handle->tick_cntr_handle, start_time, MAX_OPERATION_TIMEOUT));
        }
        IoTHubDeviceClient_LL_Destroy(device_client);
        if (handle->transport_handle != NULL)
        {
            IoTHubTransport_Destroy(handle->transport_handle);
        }
    }
    return 0;
}